

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O3

parser_error parse_themed_d(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *pcVar3;
  size_t sVar4;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar3 = parser_getstr(p,"text");
    sVar4 = strlen(pcVar3);
    pVar1 = PARSE_ERROR_VAULT_DESC_WRONG_LENGTH;
    if (sVar4 == z_info->dungeon_wid) {
      pcVar3 = string_append(*(char **)((long)pvVar2 + 0x10),pcVar3);
      *(char **)((long)pvVar2 + 0x10) = pcVar3;
      pVar1 = PARSE_ERROR_NONE;
    }
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_themed_d(struct parser *p) {
	struct vault *v = parser_priv(p);
	const char *desc;

	if (!v)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	desc = parser_getstr(p, "text");
	if (strlen(desc) != z_info->dungeon_wid)
		return PARSE_ERROR_VAULT_DESC_WRONG_LENGTH;
	else
		v->text = string_append(v->text, desc);
	return PARSE_ERROR_NONE;
}